

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi__uint16 * stbi_load_from_file_16(FILE *f,int *x,int *y,int *comp,int req_comp)

{
  int iVar1;
  stbi__uint16 *__ptr;
  stbi__context s;
  stbi__context sStack_108;
  
  stbi__start_callbacks(&sStack_108,&stbi__stdio_callbacks,f);
  __ptr = stbi__load_and_postprocess_16bit(&sStack_108,x,y,comp,req_comp);
  if (__ptr != (stbi__uint16 *)0x0) {
    iVar1 = fseek((FILE *)f,(long)((int)sStack_108.img_buffer - (int)sStack_108.img_buffer_end),1);
    if (iVar1 == -1) {
      free(__ptr);
      stbi__g_failure_reason = "fseek() error";
      __ptr = (stbi__uint16 *)0x0;
    }
  }
  return __ptr;
}

Assistant:

STBIDEF stbi__uint16 *stbi_load_from_file_16(FILE *f, int *x, int *y, int *comp, int req_comp)
{
   stbi__uint16 *result;
   stbi__context s;
   stbi__start_file(&s,f);
   result = stbi__load_and_postprocess_16bit(&s,x,y,comp,req_comp);
   if (result) {
      // need to 'unget' all the characters in the IO buffer
      if (fseek(f, - (int) (s.img_buffer_end - s.img_buffer), SEEK_CUR) == -1) {
         stbi_image_free(result);
         return (stbi__uint16 *) stbi__errpuc("fseek() error", "File Seek Fail");
      }
   }
   return result;
}